

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage0.c
# Opt level: O0

_Bool COSE_Mac0_validate(HCOSE_MAC0 h,byte *pbKey,size_t cbKey,cose_errback *perr)

{
  _Bool _Var1;
  COSE_Mac0Message *pcose;
  cose_errback *perr_local;
  size_t cbKey_local;
  byte *pbKey_local;
  HCOSE_MAC0 h_local;
  
  _Var1 = IsValidMac0Handle(h);
  if (_Var1) {
    if (pbKey != (byte *)0x0) {
      _Var1 = _COSE_Mac_validate((COSE_MacMessage *)h,(COSE_RecipientInfo *)0x0,pbKey,cbKey,"MAC0",
                                 perr);
      return _Var1;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Mac0_validate(HCOSE_MAC0 h, const byte * pbKey, size_t cbKey, cose_errback * perr)
{
	COSE_Mac0Message * pcose = (COSE_Mac0Message *)h;
	CHECK_CONDITION(IsValidMac0Handle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pbKey != NULL, COSE_ERR_INVALID_PARAMETER);

	return _COSE_Mac_validate(pcose, NULL, pbKey, cbKey, "MAC0", perr);

errorReturn:
	return false;
}